

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  SourceLineInfo *other;
  OfType OVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  AssertionResultData *pAVar6;
  allocator<char> local_71;
  SourceLineInfo local_70;
  string local_48;
  
  if (((this->m_config).includeSuccessfulResults == false) &&
     ((assertionResult->m_resultData).resultType == Ok)) {
    return;
  }
  startSpansLazily(this);
  other = &(assertionResult->m_info).lineInfo;
  SourceLineInfo::SourceLineInfo(&local_70,other);
  sVar2 = local_70.file._M_string_length;
  std::__cxx11::string::~string((string *)&local_70);
  if (sVar2 != 0) {
    poVar4 = (this->m_config).stream;
    SourceLineInfo::SourceLineInfo(&local_70,other);
    operator<<(poVar4,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((assertionResult->m_info).capturedExpression._M_string_length != 0) {
    poVar4 = (this->m_config).stream;
    std::__cxx11::string::string
              ((string *)&local_70,(string *)&(assertionResult->m_info).capturedExpression);
    std::operator<<(poVar4,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar4 = (this->m_config).stream;
    if (((assertionResult->m_resultData).resultType & FailureBit) == Ok) {
      pcVar5 = " succeeded";
    }
    else {
      std::operator<<(poVar4," failed");
      if ((((assertionResult->m_resultData).resultType & FailureBit) != Ok) &&
         (((assertionResult->m_info).resultDisposition & SuppressFail) == Normal))
      goto LAB_0012f2b7;
      poVar4 = (this->m_config).stream;
      pcVar5 = " - but was ok";
    }
    std::operator<<(poVar4,pcVar5);
  }
LAB_0012f2b7:
  OVar1 = (assertionResult->m_resultData).resultType;
  if (((uint)(OVar1 + Info) < 2) || ((uint)(OVar1 + 0xfffffff0) < 2)) {
LAB_0012f373:
    if ((assertionResult->m_info).capturedExpression._M_string_length != 0) goto LAB_0012f4b8;
    poVar4 = (this->m_config).stream;
    if ((OVar1 & FailureBit) == Ok) {
      pcVar5 = " succeeded";
    }
    else {
      std::operator<<(poVar4," failed");
      if ((((assertionResult->m_resultData).resultType & FailureBit) != Ok) &&
         (((assertionResult->m_info).resultDisposition & SuppressFail) == Normal))
      goto LAB_0012f4b8;
      poVar4 = (this->m_config).stream;
      pcVar5 = " - but was ok";
    }
LAB_0012f4b3:
    std::operator<<(poVar4,pcVar5);
    goto LAB_0012f4b8;
  }
  if (OVar1 == Info) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"info",&local_71);
    std::__cxx11::string::string
              ((string *)&local_48,(string *)&(assertionResult->m_resultData).message);
    streamVariableLengthText(this,&local_70.file,&local_48);
LAB_0012f46a:
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    if (OVar1 == Warning) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"warning",&local_71);
      std::__cxx11::string::string
                ((string *)&local_48,(string *)&(assertionResult->m_resultData).message);
      streamVariableLengthText(this,&local_70.file,&local_48);
      goto LAB_0012f46a;
    }
    if (OVar1 == ExplicitFailure) {
      poVar4 = std::operator<<((this->m_config).stream,"failed with message: \'");
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(assertionResult->m_resultData).message);
      poVar4 = std::operator<<(poVar4,(string *)&local_70);
      std::operator<<(poVar4,"\'");
    }
    else {
      if (OVar1 == Exception) goto LAB_0012f373;
      if (OVar1 == DidntThrowException) {
        poVar4 = (this->m_config).stream;
        if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
          pcVar5 = "No exception thrown where one was expected";
        }
        else {
          pcVar5 = " because no exception was thrown where one was expected";
        }
        goto LAB_0012f4b3;
      }
      if (OVar1 != ThrewException) goto LAB_0012f4b8;
      pcVar5 = " with unexpected";
      if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
        pcVar5 = "Unexpected";
      }
      std::operator<<((this->m_config).stream,pcVar5);
      poVar4 = std::operator<<((this->m_config).stream," exception with message: \'");
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(assertionResult->m_resultData).message);
      poVar4 = std::operator<<(poVar4,(string *)&local_70);
      std::operator<<(poVar4,"\'");
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
LAB_0012f4b8:
  bVar3 = AssertionResult::hasExpandedExpression(assertionResult);
  if (bVar3) {
    std::operator<<((this->m_config).stream," for: ");
    pAVar6 = &assertionResult->m_resultData;
    std::__cxx11::string::string((string *)&local_70,(string *)pAVar6);
    sVar2 = local_70.file._M_string_length;
    std::__cxx11::string::~string((string *)&local_70);
    if (0x28 < sVar2) {
      std::operator<<((this->m_config).stream,"\n");
      std::__cxx11::string::string((string *)&local_70,(string *)pAVar6);
      std::__cxx11::string::~string((string *)&local_70);
      if (local_70.file._M_string_length < 0x46) {
        std::operator<<((this->m_config).stream,"\t");
      }
    }
    poVar4 = (this->m_config).stream;
    std::__cxx11::string::string((string *)&local_70,(string *)pAVar6);
    std::operator<<(poVar4,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::endl<char,std::char_traits<char>>((this->m_config).stream);
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.includeSuccessfulResults && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                TextColour colour( TextColour::FileName );
                m_config.stream << assertionResult.getSourceInfo();
            }

            if( assertionResult.hasExpression() ) {
                TextColour colour( TextColour::OriginalExpression );
                m_config.stream << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    TextColour successColour( TextColour::Success );
                    m_config.stream << " succeeded";
                }
                else {
                    TextColour errorColour( TextColour::Error );
                    m_config.stream << " failed";
                    if( assertionResult.isOk() ) {
                        TextColour okAnywayColour( TextColour::Success );
                        m_config.stream << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " with unexpected";
                        else
                            m_config.stream << "Unexpected";
                        m_config.stream << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " because no exception was thrown where one was expected";
                        else
                            m_config.stream << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        TextColour colour( TextColour::Error );
                        m_config.stream << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            TextColour colour( TextColour::Success );
                            m_config.stream << " succeeded";
                        }
                        else {
                            TextColour colour( TextColour::Error );
                            m_config.stream << " failed";
                            if( assertionResult.isOk() ) {
                                TextColour okAnywayColour( TextColour::Success );
                                m_config.stream << " - but was ok";
                            }
                        }
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream << "\t";
                }
                TextColour colour( TextColour::ReconstructedExpression );
                m_config.stream << assertionResult.getExpandedExpression();
            }
            m_config.stream << std::endl;
        }